

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O1

void __thiscall CVmObjFile::switch_read_write_mode(CVmObjFile *this,int writing)

{
  ulong *puVar1;
  long lVar2;
  char *pcVar3;
  ulong uVar4;
  long *plVar5;
  long lVar6;
  
  if ((writing != 0) && (lVar2 = *(long *)((this->super_CVmObject).ext_ + 0x20), lVar2 != 0)) {
    *(undefined8 *)(lVar2 + 8) = 0;
  }
  pcVar3 = (this->super_CVmObject).ext_;
  uVar4 = *(ulong *)(pcVar3 + 0x18);
  if ((uVar4 & 2) != 0) {
    if ((writing == 0) != ((uVar4 & 4) == 0)) {
      plVar5 = *(long **)(pcVar3 + 8);
      lVar6 = (**(code **)(*plVar5 + 0x38))(plVar5);
      lVar2 = *(long *)((this->super_CVmObject).ext_ + 0x20);
      if (lVar2 != 0) {
        lVar6 = lVar6 - *(long *)(lVar2 + 8);
      }
      (**(code **)(*plVar5 + 0x40))(plVar5,lVar6,0);
    }
  }
  puVar1 = (ulong *)((this->super_CVmObject).ext_ + 0x18);
  *puVar1 = *puVar1 | 2;
  pcVar3 = (this->super_CVmObject).ext_;
  *(ulong *)(pcVar3 + 0x18) =
       (*(ulong *)(pcVar3 + 0x18) & 0xfffffffffffffffb) + (ulong)(writing != 0) * 4;
  return;
}

Assistant:

void CVmObjFile::switch_read_write_mode(VMG_ int writing)
{
    /* if we're writing, invalidate the read buffer */
    if (writing && get_ext()->readbuf != 0)
        get_ext()->readbuf->rem = 0;

    /* 
     *   if we just performed a read or write operation, we must seek if
     *   we're performing the opposite type of operation now 
     */
    if ((get_ext()->flags & VMOBJFILE_STDIO_BUF_DIRTY) != 0)
    {
        int was_writing;

        /* check what type of operation we did last */
        was_writing = ((get_ext()->flags & VMOBJFILE_LAST_OP_WRITE) != 0);

        /* 
         *   if we're switching operations, explicitly seek to the current
         *   location to flush the stdio buffers 
         */
        if ((writing && !was_writing) || (!writing && was_writing))
            get_ext()->fp->seek(get_pos(vmg0_), OSFSK_SET);
    }

    /* 
     *   remember that this operation is stdio-buffered, so that we'll know
     *   we need to seek if we perform the opposite operation after this one 
     */
    get_ext()->flags |= VMOBJFILE_STDIO_BUF_DIRTY;

    /* remember which type of operation we're performing */
    if (writing)
        get_ext()->flags |= VMOBJFILE_LAST_OP_WRITE;
    else
        get_ext()->flags &= ~VMOBJFILE_LAST_OP_WRITE;
}